

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O0

double __thiscall anon_unknown.dwarf_26820::StopWatch::operator()(StopWatch *this,Times type)

{
  int in_ESI;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RDI;
  double ret;
  type tp;
  uint in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  duration<double,_std::ratio<1L,_1000000L>_> in_stack_ffffffffffffffc0;
  duration<double,_std::ratio<1L,_1000L>_> local_38;
  duration<double,_std::ratio<1L,_1L>_> local_30;
  rep local_28;
  undefined8 local_20;
  rep_conflict local_18;
  int local_c;
  
  local_c = in_ESI;
  local_20 = std::chrono::_V2::system_clock::now();
  local_18 = (rep_conflict)
             std::chrono::operator-
                       ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),in_RDI);
  if (local_c == 0) {
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffffc0.__r,
               (duration<long,_std::ratio<1L,_1000000000L>_> *)(ulong)in_stack_ffffffffffffffb8);
    local_28 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_30);
  }
  else if (local_c == 1) {
    std::chrono::duration<double,std::ratio<1l,1000l>>::
    duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<double,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffffc0.__r,
               (duration<long,_std::ratio<1L,_1000000000L>_> *)CONCAT44(1,in_stack_ffffffffffffffb8)
              );
    local_28 = std::chrono::duration<double,_std::ratio<1L,_1000L>_>::count(&local_38);
  }
  else if (local_c == 2) {
    std::chrono::duration<double,std::ratio<1l,1000000l>>::
    duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<double,_std::ratio<1L,_1000000L>_> *)in_stack_ffffffffffffffc0.__r,
               (duration<long,_std::ratio<1L,_1000000000L>_> *)CONCAT44(2,in_stack_ffffffffffffffb8)
              );
    local_28 = std::chrono::duration<double,_std::ratio<1L,_1000000L>_>::count
                         ((duration<double,_std::ratio<1L,_1000000L>_> *)&stack0xffffffffffffffc0);
  }
  return local_28;
}

Assistant:

double operator()(Times type) const {
    auto tp = std::chrono::high_resolution_clock::now() - tp_;
    double ret;

    switch (type) {
      case Times::sec:
        ret = std::chrono::duration<double>(tp).count();
        break;
      case Times::milli:
        ret = std::chrono::duration<double, std::milli>(tp).count();
        break;
      case Times::micro:
        ret = std::chrono::duration<double, std::micro>(tp).count();
        break;
    }

    return ret;
  }